

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_shuffler.cpp
# Opt level: O1

ItemSource * __thiscall
WorldShuffler::place_item_randomly
          (WorldShuffler *this,Item *item,
          vector<ItemSource_*,_std::allocator<ItemSource_*>_> *possible_sources)

{
  Item **__src;
  pointer *pppIVar1;
  pointer ppIVar2;
  pointer ppIVar3;
  ItemSource *source;
  Item **ppIVar4;
  bool bVar5;
  mapped_type_conflict2 *pmVar6;
  __normal_iterator<Item_**,_std::vector<Item_*,_std::allocator<Item_*>_>_> __dest;
  LandstalkerException *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ItemSource *pIVar9;
  pointer ppIVar10;
  Item *local_e0;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *local_d8;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_d0._M_dataplus._M_p._0_1_ = item->_id;
  local_e0 = item;
  pmVar6 = std::
           map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
           ::operator[](&this->_item_pool_quantities,(key_type_conflict *)&local_d0);
  if (*pmVar6 == 0) {
    pIVar9 = (ItemSource *)0x0;
  }
  else {
    vectools::shuffle<ItemSource*>(possible_sources,&this->_rng);
    ppIVar2 = (possible_sources->super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppIVar3 = (possible_sources->super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    local_d8 = possible_sources;
    if (ppIVar2 == ppIVar3) {
      pIVar9 = (ItemSource *)0x0;
    }
    else {
      pIVar9 = (ItemSource *)0x0;
      do {
        ppIVar10 = ppIVar2 + 1;
        source = *ppIVar2;
        if ((source->_item == (Item *)0x0) &&
           (bVar5 = test_item_source_compatibility(this,source,local_e0), bVar5)) {
          (*source->_vptr_ItemSource[3])(source,local_e0);
          bVar5 = true;
          pIVar9 = source;
        }
        else {
          bVar5 = false;
        }
      } while ((!bVar5) && (ppIVar2 = ppIVar10, ppIVar10 != ppIVar3));
    }
    if (pIVar9 == (ItemSource *)0x0) {
      this_00 = (LandstalkerException *)__cxa_allocate_exception(0x28);
      std::operator+(&local_70,"Could not place ",&local_e0->_name);
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_70," in any of the ");
      local_b0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
      paVar8 = &pbVar7->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p == paVar8) {
        local_b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
      }
      else {
        local_b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      }
      local_b0._M_string_length = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      std::__cxx11::to_string
                (&local_90,
                 (long)(local_d8->super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_d8->super__Vector_base<ItemSource_*,_std::allocator<ItemSource_*>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 3);
      std::operator+(&local_50,&local_b0,&local_90);
      pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_50," possible sources.");
      local_d0._M_dataplus._M_p = (pbVar7->_M_dataplus)._M_p;
      paVar8 = &pbVar7->field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p == paVar8) {
        local_d0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
        local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar7->field_2 + 8);
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      }
      else {
        local_d0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
      }
      local_d0._M_string_length = pbVar7->_M_string_length;
      (pbVar7->_M_dataplus)._M_p = (pointer)paVar8;
      pbVar7->_M_string_length = 0;
      (pbVar7->field_2)._M_local_buf[0] = '\0';
      LandstalkerException::LandstalkerException(this_00,&local_d0);
      __cxa_throw(this_00,&LandstalkerException::typeinfo,
                  LandstalkerException::~LandstalkerException);
    }
    __dest = std::
             __find_if<__gnu_cxx::__normal_iterator<Item**,std::vector<Item*,std::allocator<Item*>>>,__gnu_cxx::__ops::_Iter_equals_val<Item*const>>
                       ((this->_item_pool).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (this->_item_pool).super__Vector_base<Item_*,_std::allocator<Item_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish,&local_e0);
    __src = __dest._M_current + 1;
    ppIVar4 = (this->_item_pool).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (__src != ppIVar4) {
      memmove(__dest._M_current,__src,(long)ppIVar4 - (long)__src);
    }
    pppIVar1 = &(this->_item_pool).super__Vector_base<Item_*,_std::allocator<Item_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + -1;
    local_d0._M_dataplus._M_p._0_1_ = local_e0->_id;
    pmVar6 = std::
             map<unsigned_char,_unsigned_short,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_unsigned_short>_>_>
             ::operator[](&this->_item_pool_quantities,(key_type_conflict *)&local_d0);
    *pmVar6 = *pmVar6 - 1;
  }
  return pIVar9;
}

Assistant:

ItemSource* WorldShuffler::place_item_randomly(Item* item, std::vector<ItemSource*> possible_sources)
{
    if(_item_pool_quantities[item->id()] == 0)
        return nullptr;

    vectools::shuffle(possible_sources, _rng);

    ItemSource* picked_item_source = nullptr;
    for(ItemSource* source : possible_sources)
    {
        if(source->empty() && test_item_source_compatibility(source, item))
        {
            source->item(item);
            picked_item_source = source;
            break;
        }
    }

    if(!picked_item_source)
    {
        throw LandstalkerException("Could not place " + item->name() + " in any of the "
                                   + std::to_string(possible_sources.size()) + " possible sources.");
    }

    _item_pool.erase(std::find(_item_pool.begin(), _item_pool.end(), item));
    _item_pool_quantities[item->id()] -= 1;
    return picked_item_source;
}